

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepFrameBuffer.cpp
# Opt level: O0

DeepSlice * __thiscall Imf_3_2::DeepFrameBuffer::findSlice(DeepFrameBuffer *this,char *name)

{
  bool bVar1;
  pointer ppVar2;
  iterator i;
  map<Imf_3_2::Name,_Imf_3_2::DeepSlice,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
  *in_stack_fffffffffffffec8;
  Name *in_stack_fffffffffffffed0;
  DeepSlice *pDVar3;
  _Self local_120 [33];
  _Self local_18 [3];
  
  Name::Name(in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
  local_18[0]._M_node =
       (_Base_ptr)
       std::
       map<Imf_3_2::Name,_Imf_3_2::DeepSlice,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
       ::find(in_stack_fffffffffffffec8,(key_type *)0x192e35);
  local_120[0]._M_node =
       (_Base_ptr)
       std::
       map<Imf_3_2::Name,_Imf_3_2::DeepSlice,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
       ::end(in_stack_fffffffffffffec8);
  bVar1 = std::operator==(local_18,local_120);
  if (bVar1) {
    pDVar3 = (DeepSlice *)0x0;
  }
  else {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_> *)
                        in_stack_fffffffffffffed0);
    pDVar3 = &ppVar2->second;
  }
  return pDVar3;
}

Assistant:

DeepSlice*
DeepFrameBuffer::findSlice (const char name[])
{
    SliceMap::iterator i = _map.find (name);
    return (i == _map.end ()) ? 0 : &i->second;
}